

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QGraphicsSceneBspTreeIndex::clear(QGraphicsSceneBspTreeIndex *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *(long *)(this + 8);
  QGraphicsSceneBspTree::clear((QGraphicsSceneBspTree *)(lVar1 + 0x80));
  *(undefined4 *)(lVar1 + 0x104) = 0;
  QList<int>::clear((QList<int> *)(lVar1 + 0x150));
  lVar2 = *(long *)(lVar1 + 0x118);
  if (lVar2 != 0) {
    lVar3 = *(long *)(lVar1 + 0x110);
    lVar5 = 0;
    do {
      lVar4 = *(long *)(lVar3 + lVar5 * 8);
      if (lVar4 != 0) {
        *(undefined4 *)(*(long *)(lVar4 + 8) + 0x110) = 0xffffffff;
      }
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)(lVar1 + 0x108));
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)(lVar1 + 0x120));
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)(lVar1 + 0x138));
  *(undefined1 *)(lVar1 + 0x101) = 1;
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }